

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile_test.cpp
# Opt level: O0

int main_repl(int argc,char **argv)

{
  bool bVar1;
  command_t *source_00;
  size_type sourceSize;
  ostream *this;
  string local_d8 [32];
  value_t *local_b8;
  value_t *result;
  program_t *prog;
  source_t source;
  undefined1 local_80 [8];
  vm_t vm;
  char **argv_local;
  int argc_local;
  
  vm.dataStack.result = (value_t *)argv;
  deci::vm_t::vm_t((vm_t *)local_80);
  do {
    std::operator<<((ostream *)&std::cout,">> ");
    deci::CompileExpression((source_t *)&prog,"std::cin",(istream *)&std::cin,true);
    source_00 = std::vector<deci::command_t,_std::allocator<deci::command_t>_>::data
                          ((vector<deci::command_t,_std::allocator<deci::command_t>_> *)&prog);
    sourceSize = std::vector<deci::command_t,_std::allocator<deci::command_t>_>::size
                           ((vector<deci::command_t,_std::allocator<deci::command_t>_> *)&prog);
    result = (value_t *)deci::program_t::Create(source_00,sourceSize);
    local_b8 = deci::vm_t::Run((vm_t *)local_80,result);
    (*result->_vptr_value_t[3])();
    bVar1 = deci::value_t::IsNothing(local_b8);
    if (!bVar1) {
      (*local_b8->_vptr_value_t[4])(local_d8);
      this = std::operator<<((ostream *)&std::cout,local_d8);
      std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_d8);
    }
    (*local_b8->_vptr_value_t[3])();
    std::vector<deci::command_t,_std::allocator<deci::command_t>_>::~vector
              ((vector<deci::command_t,_std::allocator<deci::command_t>_> *)&prog);
  } while( true );
}

Assistant:

int main_repl(int argc, char* argv[]) {

  deci::vm_t vm;

  while (true) {
    std::cout << ">> ";

    deci::program_t::source_t source = deci::CompileExpression("std::cin", std::cin, true);
    deci::program_t* prog = deci::program_t::Create(source.data(), source.size());
    deci::value_t* result = vm.Run(*prog);
    prog->Delete();

    if (!result->IsNothing())
    {
      std::cout << result->ToText() << std::endl;
    }
    result->Delete();
  }

  return 0;
}